

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_joinref.cpp
# Opt level: O1

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind(Binder *this,JoinRef *ref)

{
  BindContext *pBVar1;
  BindContext *this_00;
  JoinRefType JVar2;
  byte bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> _Var5;
  LogicalType *pLVar6;
  pointer pCVar7;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *puVar8;
  pointer pbVar9;
  ClientContext *context;
  CorrelatedColumnInfo *pCVar10;
  pointer pcVar11;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var12;
  string *column_name_00;
  size_type sVar13;
  _Head_base<0UL,_duckdb::BoundJoinRef_*,_false> _Var14;
  optional_ptr<duckdb::Binder,_true> oVar15;
  type pBVar16;
  TableRef *pTVar17;
  undefined **ppuVar18;
  undefined **ppuVar19;
  pointer puVar20;
  char cVar21;
  bool bVar22;
  pointer pBVar23;
  pointer pBVar24;
  optional_ptr<duckdb::UsingColumnSet,_true> oVar25;
  iterator iVar26;
  reference pvVar27;
  UsingColumnSet *this_01;
  ComparisonExpression *this_02;
  type pUVar28;
  ConjunctionExpression *this_03;
  idx_t __val;
  undefined8 *puVar29;
  BinderException *pBVar30;
  long *plVar31;
  type pBVar32;
  pointer pCVar33;
  idx_t iVar34;
  long *plVar35;
  TableRef *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *using_column;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar36;
  BindContext *pBVar37;
  CorrelatedColumnInfo *info;
  pointer pCVar38;
  char cVar39;
  Binder *pBVar40;
  undefined8 uVar41;
  ExpressionType type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *column_name;
  pointer pbVar42;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *col;
  optional_ptr<duckdb::LogicalType,_true> oVar43;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *binding;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *this_04;
  size_type sVar44;
  RegisteredStateManager *pRVar45;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  templated_unique_single_t result;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *binding_ref;
  templated_unique_single_t set;
  vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true> left_using_bindings;
  vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true> right_using_bindings;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> left;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> result_1;
  vector<duckdb::BindingAlias,_true> left_bindings;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> result_2;
  vector<duckdb::BindingAlias,_true> right_bindings;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  extra_conditions;
  _Head_base<0UL,_duckdb::BoundJoinRef_*,_false> local_490;
  optional_ptr<duckdb::Binder,_true> local_488;
  type local_480;
  _Head_base<0UL,_duckdb::UsingColumnSet_*,_false> local_478;
  type local_470;
  Binder *local_468;
  TableRef *local_460;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  _Head_base<0UL,_duckdb::UsingColumnSet_*,_false> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  long *local_3e8;
  long *local_3e0;
  undefined **local_3d8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  undefined4 local_3b8;
  undefined4 uStack_3b4;
  undefined1 *local_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  undefined1 *local_398;
  undefined1 *local_390;
  undefined1 local_388 [24];
  vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_> local_370;
  string local_350;
  __node_base local_330;
  string local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined8 local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2d8;
  __node_base *local_2c8 [2];
  __node_base local_2b8 [4];
  size_type local_298;
  reference local_290;
  undefined1 local_288 [8];
  pointer local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  undefined1 local_258 [16];
  _Alloc_hider local_248;
  undefined1 local_238 [32];
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_218;
  _Alloc_hider local_200;
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [144];
  vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  local_160;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_148;
  BindContext local_110;
  
  local_238._16_8_ = this;
  local_490._M_head_impl = (BoundJoinRef *)operator_new(0x90);
  JVar2 = *(JoinRefType *)((long)&in_RDX[1].alias._M_string_length + 1);
  ((local_490._M_head_impl)->super_BoundTableRef).type = JOIN;
  ((local_490._M_head_impl)->super_BoundTableRef).sample.
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false> =
       (_Head_base<0UL,_duckdb::SampleOptions_*,_false>)0x0;
  ((local_490._M_head_impl)->super_BoundTableRef)._vptr_BoundTableRef =
       (_func_int **)&PTR__BoundJoinRef_019acc20;
  ((local_490._M_head_impl)->duplicate_eliminated_columns).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_490._M_head_impl)->duplicate_eliminated_columns).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_490._M_head_impl)->condition).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false> =
       (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
  ((local_490._M_head_impl)->duplicate_eliminated_columns).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_490._M_head_impl)->left).
  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false> =
       (_Head_base<0UL,_duckdb::BoundTableRef_*,_false>)0x0;
  ((local_490._M_head_impl)->right).
  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false> =
       (_Head_base<0UL,_duckdb::BoundTableRef_*,_false>)0x0;
  ((local_490._M_head_impl)->right_binder).internal.
  super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((local_490._M_head_impl)->right_binder).internal.
  super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((local_490._M_head_impl)->left_binder).internal.
  super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((local_490._M_head_impl)->left_binder).internal.
  super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_490._M_head_impl)->type = INNER;
  (local_490._M_head_impl)->ref_type = JVar2;
  (local_490._M_head_impl)->lateral = false;
  ((local_490._M_head_impl)->correlated_columns).
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_490._M_head_impl)->mark_index = 0;
  ((local_490._M_head_impl)->correlated_columns).
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_490._M_head_impl)->correlated_columns).
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.ptr = (Binder *)ref;
  CreateBinder((Binder *)local_3d8,(ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p,
               (optional_ptr<duckdb::Binder,_true>)ref,REGULAR_BINDER);
  pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_490);
  ppuVar19 = local_3d8[1];
  ppuVar18 = local_3d8[0];
  local_3d8[0] = (undefined **)0x0;
  local_3d8[1] = (undefined **)0x0;
  p_Var4 = (pBVar23->left_binder).internal.
           super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar23->left_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)ppuVar18;
  (pBVar23->left_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar19;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8[1]);
  }
  CreateBinder((Binder *)local_3d8,(local_488.ptr)->context,local_488,REGULAR_BINDER);
  pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_490);
  ppuVar19 = local_3d8[1];
  ppuVar18 = local_3d8[0];
  local_3d8[0] = (undefined **)0x0;
  local_3d8[1] = (undefined **)0x0;
  p_Var4 = (pBVar23->right_binder).internal.
           super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar23->right_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)ppuVar18;
  (pBVar23->right_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar19;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8[1]);
  }
  pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_490);
  local_470 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar23->left_binder);
  pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_490);
  local_480 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar23->right_binder);
  sVar13 = in_RDX[1].alias._M_string_length;
  pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_490);
  pBVar23->type = (JoinType)sVar13;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
            ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
             (in_RDX + 1));
  pBVar16 = local_470;
  oVar15.ptr = local_488.ptr;
  local_470->unnamed_subquery_index = (local_488.ptr)->unnamed_subquery_index;
  Bind((Binder *)local_3d8,(TableRef *)local_470);
  (oVar15.ptr)->unnamed_subquery_index = pBVar16->unnamed_subquery_index;
  pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_490);
  ppuVar18 = local_3d8[0];
  local_3d8[0] = (undefined **)0x0;
  _Var5._M_head_impl =
       (pBVar23->left).
       super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
       super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
  (pBVar23->left).
  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl = (BoundTableRef *)ppuVar18;
  if (_Var5._M_head_impl != (BoundTableRef *)0x0) {
    (**(code **)((long)(_Var5._M_head_impl)->_vptr_BoundTableRef + 8))();
  }
  if (local_3d8[0] != (undefined **)0x0) {
    (**(code **)((long)*local_3d8[0] + 8))();
  }
  bVar22 = *(bool *)&in_RDX[1].column_name_alias.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_490);
  pBVar23->delim_flipped = bVar22;
  LateralBinder::LateralBinder((LateralBinder *)local_3d8,local_470,(local_488.ptr)->context);
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
            ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
             &in_RDX[1].type);
  pBVar16 = local_480;
  oVar15.ptr = local_488.ptr;
  local_480->unnamed_subquery_index = (local_488.ptr)->unnamed_subquery_index;
  Bind((Binder *)&local_308,(TableRef *)local_480);
  (oVar15.ptr)->unnamed_subquery_index = pBVar16->unnamed_subquery_index;
  pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_490);
  uVar41 = local_308._M_allocated_capacity;
  local_308._M_allocated_capacity = 0;
  _Var5._M_head_impl =
       (pBVar23->right).
       super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
       super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
  (pBVar23->right).
  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl = (BoundTableRef *)uVar41;
  if (_Var5._M_head_impl != (BoundTableRef *)0x0) {
    (**(code **)((long)(_Var5._M_head_impl)->_vptr_BoundTableRef + 8))();
  }
  if ((long *)local_308._M_allocated_capacity != (long *)0x0) {
    (**(code **)(*(long *)local_308._M_allocated_capacity + 8))();
  }
  local_460 = in_RDX;
  if ((element_type *)in_RDX[1].query_location.index !=
      in_RDX[1].external_dependency.internal.
      super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    if (*(char *)&in_RDX[1].column_name_alias.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\x01') {
      ExpressionBinder::ExpressionBinder
                ((ExpressionBinder *)&local_308,local_480,(local_488.ptr)->context,false);
      oVar43.ptr = (LogicalType *)in_RDX[1].query_location.index;
      pLVar6 = (LogicalType *)
               in_RDX[1].external_dependency.internal.
               super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (oVar43.ptr != pLVar6) {
        do {
          pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                    ::operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                                  *)&local_490);
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_288,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_308._M_allocated_capacity,oVar43,false);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&pBVar23->duplicate_eliminated_columns,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)local_288);
          if (local_288 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_288 + 8))();
          }
          oVar43.ptr = (LogicalType *)&(oVar43.ptr)->type_info_;
        } while (oVar43.ptr != pLVar6);
      }
    }
    else {
      ExpressionBinder::ExpressionBinder
                ((ExpressionBinder *)&local_308,local_470,(local_488.ptr)->context,false);
      oVar43.ptr = (LogicalType *)in_RDX[1].query_location.index;
      pLVar6 = (LogicalType *)
               in_RDX[1].external_dependency.internal.
               super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (oVar43.ptr != pLVar6) {
        do {
          pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                    ::operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                                  *)&local_490);
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_288,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_308._M_allocated_capacity,oVar43,false);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&pBVar23->duplicate_eliminated_columns,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)local_288);
          if (local_288 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_288 + 8))();
          }
          oVar43.ptr = (LogicalType *)&(oVar43.ptr)->type_info_;
        } while (oVar43.ptr != pLVar6);
      }
    }
    ExpressionBinder::~ExpressionBinder((ExpressionBinder *)&local_308);
  }
  pTVar17 = local_460;
  pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_490);
  ::std::vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>::
  operator=(&(pBVar23->correlated_columns).
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            ,&(local_480->correlated_columns).
              super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           );
  pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_490);
  pCVar38 = (pBVar23->correlated_columns).
            super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            .
            super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar7 = (pBVar23->correlated_columns).
           super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           .
           super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar38 == pCVar7) {
    bVar22 = false;
  }
  else {
    bVar22 = false;
    do {
      pCVar33 = pCVar38 + 1;
      if (pCVar38->depth == 1) {
        bVar22 = true;
        break;
      }
      pCVar38 = pCVar33;
    } while (pCVar33 != pCVar7);
  }
  pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_490);
  pBVar23->lateral = bVar22;
  pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_490);
  if ((pBVar23->lateral == true) && ((byte)((byte)pTVar17[1].alias._M_string_length | 2) != 3)) {
    pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
    local_308._M_allocated_capacity = (size_type)&local_2f8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_308,
               "The combining JOIN type must be INNER or LEFT for a LATERAL reference","");
    BinderException::BinderException(pBVar30,(string *)&local_308);
    __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_3d8[0] = &PTR__LateralBinder_019ad530;
  ::std::vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>::
  ~vector((vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_> *)
          (local_388 + 0x18));
  ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_3d8);
  local_218.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_458.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cVar39 = *(char *)((long)&pTVar17[1].alias._M_string_length + 1);
  if (cVar39 != '\0') {
    if (cVar39 == '\x01') {
      local_308._M_allocated_capacity = (size_type)&aStack_2d8;
      local_308._8_8_ = &DAT_00000001;
      local_2f8._M_allocated_capacity = 0;
      local_2f8._8_8_ = 0;
      local_2e8 = 0x3f800000;
      local_2e0 = 0;
      aStack_2d8._M_allocated_capacity = 0;
      this_04 = (local_470->bind_context).bindings_list.
                super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar8 = (local_470->bind_context).bindings_list.
               super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (this_04 != puVar8) {
        do {
          pBVar24 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                    operator->(this_04);
          pbVar9 = (pBVar24->names).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar42 = (pBVar24->names).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar42 != pbVar9;
              pbVar42 = pbVar42 + 1) {
            local_3d8[0] = (undefined **)&local_308;
            ::std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&local_308,pbVar42,
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_3d8);
          }
          this_04 = this_04 + 1;
        } while (this_04 != puVar8);
      }
      if (local_2f8._M_allocated_capacity != 0) {
        pBVar1 = &local_480->bind_context;
        uVar41 = local_2f8._M_allocated_capacity;
        do {
          column_name_00 = (string *)(uVar41 + 8);
          oVar25 = BindContext::GetUsingBinding(pBVar1,column_name_00);
          BindingAlias::BindingAlias((BindingAlias *)local_3d8);
          if (oVar25.ptr == (UsingColumnSet *)0x0) {
            local_288 = (undefined1  [8])&local_278;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"right","");
            bVar22 = TryFindBinding(local_480,column_name_00,(string *)local_288,
                                    (BindingAlias *)local_3d8);
            if (local_288 != (undefined1  [8])&local_278) {
              operator_delete((void *)local_288);
            }
            if (bVar22) goto LAB_007118af;
          }
          else {
LAB_007118af:
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_458,column_name_00);
          }
          if (local_398 != local_388) {
            operator_delete(local_398);
          }
          if ((undefined8 *)CONCAT44(uStack_3b4,local_3b8) != &uStack_3a8) {
            operator_delete((undefined1 *)CONCAT44(uStack_3b4,local_3b8));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8[0] != &local_3c8) {
            operator_delete(local_3d8[0]);
          }
          uVar41 = *(undefined8 *)uVar41;
        } while (uVar41 != 0);
      }
      if (local_458.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_458.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_3d8[0] = (undefined **)&local_3c8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3d8,"No columns found to join on in NATURAL JOIN.\n","");
        ::std::__cxx11::string::append
                  (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8)->_M_local_buf);
        local_288 = (undefined1  [8])&local_278;
        local_280 = (pointer)0x0;
        local_278._M_local_buf[0] = '\0';
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        local_350._M_string_length = 0;
        local_350.field_2._M_local_buf[0] = '\0';
        pBVar40 = (Binder *)
                  (local_470->bind_context).bindings_list.
                  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_468 = (Binder *)
                    (local_470->bind_context).bindings_list.
                    super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (pBVar40 != local_468) {
          do {
            local_488.ptr = pBVar40;
            pBVar32 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                      operator*((unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>
                                 *)pBVar40);
            pbVar9 = (pBVar32->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar42 = (pBVar32->names).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar42 != pbVar9;
                pbVar42 = pbVar42 + 1) {
              if (local_280 != (pointer)0x0) {
                ::std::__cxx11::string::append(local_288);
              }
              Binding::GetAlias_abi_cxx11_(&local_328,pBVar32);
              plVar31 = (long *)::std::__cxx11::string::append((char *)&local_328);
              plVar35 = plVar31 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar31 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar35) {
                local_408.field_2._M_allocated_capacity = *plVar35;
                local_408.field_2._8_8_ = plVar31[3];
                local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
              }
              else {
                local_408.field_2._M_allocated_capacity = *plVar35;
                local_408._M_dataplus._M_p = (pointer)*plVar31;
              }
              local_408._M_string_length = plVar31[1];
              *plVar31 = (long)plVar35;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              ::std::operator+(&local_438,&local_408,pbVar42);
              ::std::__cxx11::string::_M_append(local_288,(ulong)local_438._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438._M_dataplus._M_p != &local_438.field_2) {
                operator_delete(local_438._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_408._M_dataplus._M_p != &local_408.field_2) {
                operator_delete(local_408._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != &local_328.field_2) {
                operator_delete(local_328._M_dataplus._M_p);
              }
            }
            pBVar40 = (Binder *)
                      &((local_488.ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_
                       .internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
          } while (pBVar40 != local_468);
        }
        pBVar40 = (Binder *)
                  (local_480->bind_context).bindings_list.
                  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_468 = (Binder *)
                    (local_480->bind_context).bindings_list.
                    super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (pBVar40 != local_468) {
          do {
            local_488.ptr = pBVar40;
            pBVar32 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                      operator*((unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>
                                 *)pBVar40);
            pbVar9 = (pBVar32->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar42 = (pBVar32->names).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar42 != pbVar9;
                pbVar42 = pbVar42 + 1) {
              if (local_350._M_string_length != 0) {
                ::std::__cxx11::string::append((char *)&local_350);
              }
              Binding::GetAlias_abi_cxx11_(&local_328,pBVar32);
              puVar29 = (undefined8 *)::std::__cxx11::string::append((char *)&local_328);
              plVar31 = puVar29 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar29 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar31) {
                local_408.field_2._M_allocated_capacity = *plVar31;
                local_408.field_2._8_8_ = puVar29[3];
                local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
              }
              else {
                local_408.field_2._M_allocated_capacity = *plVar31;
                local_408._M_dataplus._M_p = (pointer)*puVar29;
              }
              local_408._M_string_length = puVar29[1];
              *puVar29 = plVar31;
              puVar29[1] = 0;
              *(undefined1 *)(puVar29 + 2) = 0;
              ::std::operator+(&local_438,&local_408,pbVar42);
              ::std::__cxx11::string::_M_append
                        ((char *)&local_350,(ulong)local_438._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438._M_dataplus._M_p != &local_438.field_2) {
                operator_delete(local_438._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_408._M_dataplus._M_p != &local_408.field_2) {
                operator_delete(local_408._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != &local_328.field_2) {
                operator_delete(local_328._M_dataplus._M_p);
              }
            }
            pBVar40 = (Binder *)
                      &((local_488.ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_
                       .internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
          } while (pBVar40 != local_468);
        }
        ::std::operator+(&local_438,"\n   Left candidates: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_288);
        ::std::__cxx11::string::_M_append
                  (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8)->_M_local_buf,(ulong)local_438._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p);
        }
        ::std::operator+(&local_438,"\n   Right candidates: ",&local_350);
        ::std::__cxx11::string::_M_append
                  (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8)->_M_local_buf,(ulong)local_438._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p);
        }
        pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
        BinderException::BinderException<>(pBVar30,local_460,(string *)local_3d8);
        __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&local_308);
      goto LAB_0071193c;
    }
    if (cVar39 != '\x04') goto LAB_0071193c;
  }
  if (pTVar17[1].alias.field_2._M_allocated_capacity !=
      *(size_type *)((long)&pTVar17[1].alias.field_2 + 8)) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_458,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pTVar17[1].alias.field_2);
  }
LAB_0071193c:
  pbVar42 = local_458.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_308._M_allocated_capacity = 0;
  local_308._8_8_ = 0;
  local_2f8._M_allocated_capacity = 0;
  local_3d8[0] = (undefined **)&uStack_3a8;
  local_3d8[1] = (undefined **)&DAT_00000001;
  local_3c8._M_allocated_capacity = 0;
  local_3c8._8_8_ = 0;
  local_3b8 = 0x3f800000;
  local_3b0 = (undefined1 *)0x0;
  uStack_3a8 = 0;
  if (local_458.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_458.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar26 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_3d8,(key_type *)paVar36);
      if (iVar26.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_288 = (undefined1  [8])local_3d8;
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_3d8,paVar36,local_288);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_308._M_local_buf,(value_type *)paVar36);
      }
      paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar36->_M_local_buf + 0x20);
    } while (paVar36 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pbVar42);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_3d8);
  local_3c8._M_allocated_capacity =
       (size_type)
       local_458.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3d8[1] = (undefined **)
                 local_458.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  local_3d8[0] = (undefined **)
                 local_458.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_458.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_308._M_allocated_capacity;
  local_458.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_308._8_8_;
  local_458.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2f8._M_allocated_capacity;
  local_308._M_allocated_capacity = 0;
  local_308._8_8_ = 0;
  local_2f8._M_allocated_capacity = 0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8)->_M_local_buf);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_308._M_local_buf);
  if (local_458.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_458.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_438._M_dataplus._M_p = (pointer)0x0;
    local_438._M_string_length = 0;
    local_438.field_2._M_allocated_capacity = 0;
    local_408.field_2._M_allocated_capacity = 0;
    local_408._M_dataplus._M_p = (pointer)0x0;
    local_408._M_string_length = 0;
    if (local_458.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_458.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pBVar1 = &local_470->bind_context;
      pBVar37 = &local_480->bind_context;
      sVar44 = 0;
      do {
        pvVar27 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&local_458,sVar44);
        local_3d8[0] = (undefined **)BindContext::GetUsingBinding(pBVar1,pvVar27);
        local_308._M_allocated_capacity = (size_type)BindContext::GetUsingBinding(pBVar37,pvVar27);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8[0] ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          BindContext::GetMatchingBinding(pBVar1,pvVar27);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_allocated_capacity ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          BindContext::GetMatchingBinding(pBVar37,pvVar27);
        }
        if (local_438._M_string_length == local_438.field_2._M_allocated_capacity) {
          ::std::
          vector<duckdb::optional_ptr<duckdb::UsingColumnSet,true>,std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,true>>>
          ::_M_realloc_insert<duckdb::optional_ptr<duckdb::UsingColumnSet,true>const&>
                    ((vector<duckdb::optional_ptr<duckdb::UsingColumnSet,true>,std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,true>>>
                      *)&local_438,(iterator)local_438._M_string_length,
                     (optional_ptr<duckdb::UsingColumnSet,_true> *)
                     &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_3d8)->_M_allocated_capacity);
        }
        else {
          *(UsingColumnSet **)local_438._M_string_length = (UsingColumnSet *)local_3d8[0];
          local_438._M_string_length = local_438._M_string_length + 8;
        }
        if (local_408._M_string_length == local_408.field_2._M_allocated_capacity) {
          ::std::
          vector<duckdb::optional_ptr<duckdb::UsingColumnSet,true>,std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,true>>>
          ::_M_realloc_insert<duckdb::optional_ptr<duckdb::UsingColumnSet,true>const&>
                    ((vector<duckdb::optional_ptr<duckdb::UsingColumnSet,true>,std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,true>>>
                      *)&local_408,(iterator)local_408._M_string_length,
                     (optional_ptr<duckdb::UsingColumnSet,_true> *)&local_308._M_allocated_capacity)
          ;
        }
        else {
          *(UsingColumnSet **)local_408._M_string_length =
               (UsingColumnSet *)local_308._M_allocated_capacity;
          local_408._M_string_length = local_408._M_string_length + 8;
        }
        sVar44 = sVar44 + 1;
      } while (sVar44 < (ulong)((long)local_458.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_458.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if (local_458.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_458.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar36 = &local_350.field_2;
      local_238._24_8_ = &(local_488.ptr)->bind_context;
      local_1f8 = (undefined1  [8])&local_470->bind_context;
      local_200._M_p = (pointer)&local_480->bind_context;
      sVar44 = 0;
      do {
        local_298 = sVar44;
        pvVar27 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&local_458,sVar44);
        BindingAlias::BindingAlias((BindingAlias *)&local_308);
        BindingAlias::BindingAlias((BindingAlias *)local_288);
        this_01 = (UsingColumnSet *)operator_new(0x78);
        (this_01->bindings).
        super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
        super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (this_01->bindings).
        super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
        super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (this_01->primary_binding).alias.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(this_01->primary_binding).alias.field_2 + 8) = 0;
        (this_01->primary_binding).alias._M_dataplus._M_p = (pointer)0x0;
        (this_01->primary_binding).alias._M_string_length = 0;
        (this_01->primary_binding).schema.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(this_01->primary_binding).schema.field_2 + 8) = 0;
        (this_01->primary_binding).schema._M_dataplus._M_p = (pointer)0x0;
        (this_01->primary_binding).schema._M_string_length = 0;
        (this_01->primary_binding).catalog.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(this_01->primary_binding).catalog.field_2 + 8) = 0;
        (this_01->primary_binding).catalog._M_dataplus._M_p = (pointer)0x0;
        (this_01->primary_binding).catalog._M_string_length = 0;
        (this_01->bindings).
        super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
        super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        BindingAlias::BindingAlias((BindingAlias *)this_01);
        sVar44 = local_298;
        (this_01->bindings).
        super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
        super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (this_01->bindings).
        super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
        super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (this_01->bindings).
        super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
        super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_478._M_head_impl = this_01;
        local_468 = (Binder *)
                    vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true>::operator[]
                              ((vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true> *)
                               &local_438,local_298);
        local_290 = vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true>::operator[]
                              ((vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true> *)
                               &local_408,sVar44);
        oVar25.ptr = *(UsingColumnSet **)&local_468->super_enable_shared_from_this<duckdb::Binder>;
        pBVar40 = (Binder *)0x13bb347;
        local_350._M_dataplus._M_p = (pointer)paVar36;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"left","");
        RetrieveUsingBinding((BindingAlias *)local_3d8,pBVar40,local_470,oVar25,pvVar27,&local_350);
        ::std::__cxx11::string::operator=
                  ((string *)local_308._M_local_buf,
                   (string *)
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8)->_M_local_buf);
        ::std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_3b8);
        ::std::__cxx11::string::operator=((string *)local_2c8,(string *)&local_398);
        if (local_398 != local_388) {
          operator_delete(local_398);
        }
        if ((undefined8 *)CONCAT44(uStack_3b4,local_3b8) != &uStack_3a8) {
          operator_delete((undefined1 *)CONCAT44(uStack_3b4,local_3b8));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8[0] != &local_3c8) {
          operator_delete(local_3d8[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != paVar36) {
          operator_delete(local_350._M_dataplus._M_p);
        }
        oVar25.ptr = local_290->ptr;
        pBVar40 = (Binder *)0x13bb444;
        local_350._M_dataplus._M_p = (pointer)paVar36;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"right","");
        RetrieveUsingBinding((BindingAlias *)local_3d8,pBVar40,local_480,oVar25,pvVar27,&local_350);
        ::std::__cxx11::string::operator=
                  ((string *)local_288,
                   (string *)
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8)->_M_local_buf);
        ::std::__cxx11::string::operator=((string *)&local_268,(string *)&local_3b8);
        ::std::__cxx11::string::operator=((string *)(local_258 + 0x10),(string *)&local_398);
        if (local_398 != local_388) {
          operator_delete(local_398);
        }
        if ((undefined8 *)CONCAT44(uStack_3b4,local_3b8) != &uStack_3a8) {
          operator_delete((undefined1 *)CONCAT44(uStack_3b4,local_3b8));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8[0] != &local_3c8) {
          operator_delete(local_3d8[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != paVar36) {
          operator_delete(local_350._M_dataplus._M_p);
        }
        pBVar16 = local_470;
        type = COMPARE_BOUNDARY_START;
        if (*(char *)((long)&local_460[1].alias._M_string_length + 1) == '\x04') {
          type = (local_298 ==
                 ((long)local_458.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_458.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) * '\x05' +
                 COMPARE_BOUNDARY_START;
        }
        context = (local_488.ptr)->context;
        ExpressionBinder::ExpressionBinder((ExpressionBinder *)local_3d8,local_470,context,false);
        BindColumn((duckdb *)&local_3e0,pBVar16,context,(BindingAlias *)&local_308,pvVar27);
        BindColumn((duckdb *)&local_3e8,local_480,context,(BindingAlias *)local_288,pvVar27);
        this_02 = (ComparisonExpression *)operator_new(0x48);
        local_350._M_dataplus._M_p = (pointer)local_3e0;
        local_3e0 = (long *)0x0;
        local_328._M_dataplus._M_p = (pointer)local_3e8;
        local_3e8 = (long *)0x0;
        ComparisonExpression::ComparisonExpression
                  (this_02,type,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_350,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_328);
        if ((long *)local_328._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_328._M_dataplus._M_p + 8))();
        }
        local_328._M_dataplus._M_p = (pointer)0x0;
        if ((long *)local_350._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_350._M_dataplus._M_p + 8))();
        }
        local_330._M_nxt = (_Hash_node_base *)this_02;
        ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_3d8);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_218,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_330);
        if ((ComparisonExpression *)local_330._M_nxt != (ComparisonExpression *)0x0) {
          (*(((ParsedExpression *)&(local_330._M_nxt)->_M_nxt)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        pUVar28 = unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                  ::operator*((unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                               *)&local_478);
        AddUsingBindings(pUVar28,*(UsingColumnSet **)
                                  &local_468->super_enable_shared_from_this<duckdb::Binder>,
                         (BindingAlias *)&local_308);
        pUVar28 = unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                  ::operator*((unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                               *)&local_478);
        AddUsingBindings(pUVar28,local_290->ptr,(BindingAlias *)local_288);
        pUVar28 = unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                  ::operator*((unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                               *)&local_478);
        bVar3 = (byte)local_460[1].alias._M_string_length;
        if (bVar3 < 0xb) {
          if ((0x6aU >> (bVar3 & 0x1f) & 1) == 0) {
            if ((0x604U >> (bVar3 & 0x1f) & 1) == 0) goto LAB_0071207a;
            ::std::__cxx11::string::_M_assign((string *)pUVar28);
            ::std::__cxx11::string::_M_assign((string *)&(pUVar28->primary_binding).schema);
          }
          else {
            ::std::__cxx11::string::_M_assign((string *)pUVar28);
            ::std::__cxx11::string::_M_assign((string *)&(pUVar28->primary_binding).schema);
          }
          ::std::__cxx11::string::_M_assign((string *)&(pUVar28->primary_binding).alias);
        }
LAB_0071207a:
        oVar25.ptr = *(UsingColumnSet **)&local_468->super_enable_shared_from_this<duckdb::Binder>;
        pUVar28 = unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                  ::operator*((unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                               *)&local_478);
        BindContext::TransferUsingBinding
                  ((BindContext *)local_238._24_8_,(BindContext *)local_1f8,oVar25,pUVar28,pvVar27);
        oVar25.ptr = local_290->ptr;
        pUVar28 = unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                  ::operator*((unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                               *)&local_478);
        BindContext::TransferUsingBinding
                  ((BindContext *)local_238._24_8_,(BindContext *)local_200._M_p,oVar25,pUVar28,
                   pvVar27);
        local_410._M_head_impl = local_478._M_head_impl;
        local_478._M_head_impl = (UsingColumnSet *)0x0;
        AddUsingBindingSet(local_488.ptr,
                           (unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                            *)&local_410);
        if (local_410._M_head_impl != (UsingColumnSet *)0x0) {
          ::std::default_delete<duckdb::UsingColumnSet>::operator()
                    ((default_delete<duckdb::UsingColumnSet> *)&local_410,local_410._M_head_impl);
        }
        local_410._M_head_impl = (UsingColumnSet *)0x0;
        if (local_478._M_head_impl != (UsingColumnSet *)0x0) {
          ::std::default_delete<duckdb::UsingColumnSet>::operator()
                    ((default_delete<duckdb::UsingColumnSet> *)&local_478,local_478._M_head_impl);
        }
        if ((ClientContext *)local_248._M_p != (ClientContext *)local_238) {
          operator_delete(local_248._M_p);
        }
        if ((DummyBinding *)local_268._M_p != (DummyBinding *)local_258) {
          operator_delete(local_268._M_p);
        }
        if (local_288 != (undefined1  [8])&local_278) {
          operator_delete((void *)local_288);
        }
        if (local_2c8[0] != local_2b8) {
          operator_delete(local_2c8[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_2e4,local_2e8) != &aStack_2d8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_2e4,local_2e8));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_allocated_capacity != &local_2f8) {
          operator_delete((void *)local_308._M_allocated_capacity);
        }
        sVar44 = local_298 + 1;
      } while (sVar44 < (ulong)((long)local_458.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_458.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    if (local_438._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_438._M_dataplus._M_p);
    }
  }
  pBVar1 = &local_480->bind_context;
  BindContext::GetBindingAliases((vector<duckdb::BindingAlias,_true> *)local_288,pBVar1);
  pBVar16 = local_470;
  pBVar37 = &local_470->bind_context;
  BindContext::GetBindingAliases((vector<duckdb::BindingAlias,_true> *)&local_350,pBVar37);
  this_00 = &(local_488.ptr)->bind_context;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&local_110,pBVar37,pBVar37);
  local_110.binder = (pBVar16->bind_context).binder;
  local_110.bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pBVar16->bind_context).bindings_list.
       super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_110.bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pBVar16->bind_context).bindings_list.
       super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_110.bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pBVar16->bind_context).bindings_list.
       super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pBVar16->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar16->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar16->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_110.using_columns._M_h,&(pBVar16->bind_context).using_columns);
  local_110.using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pBVar16->bind_context).using_column_sets.
       super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_110.using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pBVar16->bind_context).using_column_sets.
       super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_110.using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pBVar16->bind_context).using_column_sets.
       super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pBVar16->bind_context).using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar16->bind_context).using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar16->bind_context).using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_110.cte_bindings._M_h,&(pBVar16->bind_context).cte_bindings);
  BindContext::AddContext(this_00,&local_110);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_110.cte_bindings._M_h);
  ::std::
  vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ::~vector(&local_110.using_column_sets.
             super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
           );
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_110.using_columns._M_h);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ::~vector(&local_110.bindings_list.
             super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           );
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_110);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)local_1f0,pBVar1,pBVar1);
  pBVar16 = local_480;
  local_1f0._56_8_ = (local_480->bind_context).binder;
  local_1f0._64_8_ =
       (local_480->bind_context).bindings_list.
       super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1f0._72_8_ =
       (local_480->bind_context).bindings_list.
       super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1f0._80_8_ =
       (local_480->bind_context).bindings_list.
       super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_480->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_480->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_480->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(local_1f0 + 0x58),&(local_480->bind_context).using_columns);
  local_160.
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pBVar16->bind_context).using_column_sets.
       super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_160.
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pBVar16->bind_context).using_column_sets.
       super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_160.
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pBVar16->bind_context).using_column_sets.
       super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pBVar16->bind_context).using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar16->bind_context).using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar16->bind_context).using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_148,&(pBVar16->bind_context).cte_bindings);
  BindContext::AddContext(this_00,(BindContext *)local_1f0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_148);
  ::std::
  vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
             *)(local_1f0 + 0x90));
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_1f0 + 0x58));
  ::std::
  vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             *)(local_1f0 + 0x40));
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_1f0);
  pCVar10 = (local_470->correlated_columns).
            super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            .
            super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (info = (local_470->correlated_columns).
              super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
              .
              super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
              ._M_impl.super__Vector_impl_data._M_start; info != pCVar10; info = info + 1) {
    if (info->depth != 0) {
      AddCorrelatedColumn(local_488.ptr,info);
    }
  }
  pCVar38 = (local_480->correlated_columns).
            super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            .
            super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar7 = (local_480->correlated_columns).
           super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           .
           super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_468 = (Binder *)this_00;
  if (pCVar38 != pCVar7) {
    do {
      local_3d8[0] = (undefined **)(pCVar38->binding).table_index;
      local_3d8[1] = (undefined **)(pCVar38->binding).column_index;
      LogicalType::LogicalType((LogicalType *)&local_3c8,&pCVar38->type);
      pcVar11 = (pCVar38->name)._M_dataplus._M_p;
      local_3b0 = local_3a0;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3b0,pcVar11,pcVar11 + (pCVar38->name)._M_string_length);
      local_390 = (undefined1 *)pCVar38->depth;
      if (&DAT_00000001 < local_390) {
        local_390 = (undefined1 *)((long)local_390 + 0xffffffffffffffff);
        AddCorrelatedColumn(local_488.ptr,(CorrelatedColumnInfo *)local_3d8);
      }
      if (local_3b0 != local_3a0) {
        operator_delete(local_3b0);
      }
      LogicalType::~LogicalType((LogicalType *)&local_3c8);
      pCVar38 = pCVar38 + 1;
    } while (pCVar38 != pCVar7);
  }
  puVar20 = local_218.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_218.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_218.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pRVar45 = (RegisteredStateManager *)
              local_218.
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_460[1].alias._M_dataplus._M_p == (pointer)0x0) {
        pcVar11 = *(pointer *)&(pRVar45->lock).super___mutex_base;
        *(undefined8 *)&(pRVar45->lock).super___mutex_base = 0;
        plVar31 = (long *)local_460[1].alias._M_dataplus._M_p;
        local_460[1].alias._M_dataplus._M_p = pcVar11;
      }
      else {
        this_03 = (ConjunctionExpression *)operator_new(0x50);
        local_3d8[0] = (undefined **)local_460[1].alias._M_dataplus._M_p;
        local_460[1].alias._M_dataplus._M_p = (pointer)0x0;
        local_308._M_allocated_capacity = *(undefined8 *)&(pRVar45->lock).super___mutex_base;
        *(undefined8 *)&(pRVar45->lock).super___mutex_base = 0;
        ConjunctionExpression::ConjunctionExpression
                  (this_03,CONJUNCTION_AND,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3d8)->_M_allocated_capacity,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_308._M_allocated_capacity);
        if ((long *)local_308._M_allocated_capacity != (long *)0x0) {
          (**(code **)(*(long *)local_308._M_allocated_capacity + 8))();
        }
        local_308._M_allocated_capacity = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8[0] !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)((long)*local_3d8[0] + 8))();
        }
        plVar31 = (long *)local_460[1].alias._M_dataplus._M_p;
        local_460[1].alias._M_dataplus._M_p = (pointer)this_03;
      }
      if (plVar31 != (long *)0x0) {
        (**(code **)(*plVar31 + 8))();
      }
      pRVar45 = (RegisteredStateManager *)
                ((long)&(pRVar45->lock).super___mutex_base._M_mutex.__data + 8);
    } while (pRVar45 != (RegisteredStateManager *)puVar20);
  }
  pBVar40 = local_468;
  if (local_460[1].alias._M_dataplus._M_p != (pointer)0x0) {
    WhereBinder::WhereBinder
              ((WhereBinder *)local_3d8,local_488.ptr,(local_488.ptr)->context,
               (optional_ptr<duckdb::ColumnAliasBinder,_true>)0x0);
    ExpressionBinder::Bind
              ((ExpressionBinder *)&local_308,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8)->_M_allocated_capacity,
               (optional_ptr<duckdb::LogicalType,_true>)&local_460[1].alias,false);
    pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
              operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                          *)&local_490);
    uVar41 = local_308._M_allocated_capacity;
    local_308._M_allocated_capacity = 0;
    _Var12._M_head_impl =
         (pBVar23->condition).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar23->condition).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar41;
    if (_Var12._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var12._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_allocated_capacity !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*local_308._M_allocated_capacity + 8))();
    }
    ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_3d8);
  }
  pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_490);
  if (((pBVar23->type == SEMI) ||
      (pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
                 operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                             *)&local_490), pBVar23->type == ANTI)) ||
     (pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
                operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                            *)&local_490), pBVar23->type == MARK)) {
    BindContext::RemoveContext
              ((BindContext *)pBVar40,(vector<duckdb::BindingAlias,_true> *)local_288);
    pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
              operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                          *)&local_490);
    if (pBVar23->type == MARK) {
      __val = GenerateTableIndex(local_488.ptr);
      cVar39 = '\x01';
      if (9 < __val) {
        iVar34 = __val;
        cVar21 = '\x04';
        do {
          cVar39 = cVar21;
          if (iVar34 < 100) {
            cVar39 = cVar39 + -2;
            goto LAB_0071278e;
          }
          if (iVar34 < 1000) {
            cVar39 = cVar39 + -1;
            goto LAB_0071278e;
          }
          if (iVar34 < 10000) goto LAB_0071278e;
          bVar22 = 99999 < iVar34;
          iVar34 = iVar34 / 10000;
          cVar21 = cVar39 + '\x04';
        } while (bVar22);
        cVar39 = cVar39 + '\x01';
      }
LAB_0071278e:
      local_308._M_allocated_capacity = (size_type)&local_2f8;
      ::std::__cxx11::string::_M_construct((ulong)&local_308,cVar39);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_308._M_allocated_capacity,local_308._8_4_,__val);
      puVar29 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,0x138d122);
      paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar29 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar29 == paVar36) {
        local_3c8._M_allocated_capacity = paVar36->_M_allocated_capacity;
        local_3c8._8_8_ = puVar29[3];
        local_3d8[0] = (undefined **)&local_3c8;
      }
      else {
        local_3c8._M_allocated_capacity = paVar36->_M_allocated_capacity;
        local_3d8[0] = (undefined **)*puVar29;
      }
      local_3d8[1] = (undefined **)puVar29[1];
      *puVar29 = paVar36;
      puVar29[1] = 0;
      *(undefined1 *)(puVar29 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_allocated_capacity != &local_2f8) {
        operator_delete((void *)local_308._M_allocated_capacity);
      }
      local_308._M_allocated_capacity = (size_type)&local_2f8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"__mark_index_column","");
      __l._M_len = 1;
      __l._M_array = (iterator)&local_308;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_438,__l,(allocator_type *)&local_3e0);
      LogicalType::LogicalType((LogicalType *)&local_328,BOOLEAN);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_328;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_408,
                 __l_00,(allocator_type *)&local_3e8);
      BindContext::AddGenericBinding
                ((BindContext *)pBVar40,__val,(string *)local_3d8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&local_438,(vector<duckdb::LogicalType,_true> *)&local_408);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_408);
      LogicalType::~LogicalType((LogicalType *)&local_328);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_allocated_capacity != &local_2f8) {
        operator_delete((void *)local_308._M_allocated_capacity);
      }
      pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
                operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                            *)&local_490);
      pBVar23->mark_index = __val;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8[0] != &local_3c8) {
        operator_delete(local_3d8[0]);
      }
    }
  }
  pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_490);
  if ((pBVar23->type == RIGHT_SEMI) ||
     (pBVar23 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
                operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                            *)&local_490), pBVar23->type == RIGHT_ANTI)) {
    BindContext::RemoveContext
              ((BindContext *)pBVar40,(vector<duckdb::BindingAlias,_true> *)&local_350);
  }
  _Var14._M_head_impl = local_490._M_head_impl;
  local_490._M_head_impl = (BoundJoinRef *)0x0;
  *(BoundJoinRef **)local_238._16_8_ = _Var14._M_head_impl;
  ::std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>::~vector
            ((vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_> *)&local_350);
  ::std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>::~vector
            ((vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_> *)local_288);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_458);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_218);
  if (local_490._M_head_impl != (BoundJoinRef *)0x0) {
    (*((local_490._M_head_impl)->super_BoundTableRef)._vptr_BoundTableRef[1])();
  }
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
         local_238._16_8_;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(JoinRef &ref) {
	auto result = make_uniq<BoundJoinRef>(ref.ref_type);
	result->left_binder = Binder::CreateBinder(context, this);
	result->right_binder = Binder::CreateBinder(context, this);
	auto &left_binder = *result->left_binder;
	auto &right_binder = *result->right_binder;

	result->type = ref.type;
	result->left = left_binder.BindJoin(*this, *ref.left);
	result->delim_flipped = ref.delim_flipped;

	{
		LateralBinder binder(left_binder, context);
		result->right = right_binder.BindJoin(*this, *ref.right);
		if (!ref.duplicate_eliminated_columns.empty()) {
			if (ref.delim_flipped) {
				// We gotta use the expression binder of the right side
				ExpressionBinder expr_binder(right_binder, context);
				for (auto &col : ref.duplicate_eliminated_columns) {
					result->duplicate_eliminated_columns.emplace_back(expr_binder.Bind(col));
				}
			} else {
				// We use the left side
				ExpressionBinder expr_binder(left_binder, context);
				for (auto &col : ref.duplicate_eliminated_columns) {
					result->duplicate_eliminated_columns.emplace_back(expr_binder.Bind(col));
				}
			}
		}
		bool is_lateral = false;
		// Store the correlated columns in the right binder in bound ref for planning of LATERALs
		// Ignore the correlated columns in the left binder, flattening handles those correlations
		result->correlated_columns = right_binder.correlated_columns;
		// Find correlations for the current join
		for (auto &cor_col : result->correlated_columns) {
			if (cor_col.depth == 1) {
				// Depth 1 indicates columns binding from the left indicating a lateral join
				is_lateral = true;
				break;
			}
		}
		result->lateral = is_lateral;
		if (result->lateral) {
			// lateral join: can only be an INNER or LEFT join
			if (ref.type != JoinType::INNER && ref.type != JoinType::LEFT) {
				throw BinderException("The combining JOIN type must be INNER or LEFT for a LATERAL reference");
			}
		}
	}

	vector<unique_ptr<ParsedExpression>> extra_conditions;
	vector<string> extra_using_columns;
	switch (ref.ref_type) {
	case JoinRefType::NATURAL: {
		// natural join, figure out which column names are present in both sides of the join
		// first bind the left hand side and get a list of all the tables and column names
		case_insensitive_set_t lhs_columns;
		auto &lhs_binding_list = left_binder.bind_context.GetBindingsList();
		for (auto &binding : lhs_binding_list) {
			for (auto &column_name : binding->names) {
				lhs_columns.insert(column_name);
			}
		}
		// now bind the rhs
		for (auto &column_name : lhs_columns) {
			auto right_using_binding = right_binder.bind_context.GetUsingBinding(column_name);

			BindingAlias right_binding;
			// loop over the set of lhs columns, and figure out if there is a table in the rhs with the same name
			if (!right_using_binding) {
				if (!right_binder.TryFindBinding(column_name, "right", right_binding)) {
					// no match found for this column on the rhs: skip
					continue;
				}
			}
			extra_using_columns.push_back(column_name);
		}
		if (extra_using_columns.empty()) {
			// no matching bindings found in natural join: throw an exception
			string error_msg = "No columns found to join on in NATURAL JOIN.\n";
			error_msg += "Use CROSS JOIN if you intended for this to be a cross-product.";
			// gather all left/right candidates
			string left_candidates, right_candidates;
			auto &rhs_binding_list = right_binder.bind_context.GetBindingsList();
			for (auto &binding_ref : lhs_binding_list) {
				auto &binding = *binding_ref;
				for (auto &column_name : binding.names) {
					if (!left_candidates.empty()) {
						left_candidates += ", ";
					}
					left_candidates += binding.GetAlias() + "." + column_name;
				}
			}
			for (auto &binding_ref : rhs_binding_list) {
				auto &binding = *binding_ref;
				for (auto &column_name : binding.names) {
					if (!right_candidates.empty()) {
						right_candidates += ", ";
					}
					right_candidates += binding.GetAlias() + "." + column_name;
				}
			}
			error_msg += "\n   Left candidates: " + left_candidates;
			error_msg += "\n   Right candidates: " + right_candidates;
			throw BinderException(ref, error_msg);
		}
		break;
	}
	case JoinRefType::REGULAR:
	case JoinRefType::ASOF:
		if (!ref.using_columns.empty()) {
			// USING columns
			D_ASSERT(!result->condition);
			extra_using_columns = ref.using_columns;
		}
		break;

	case JoinRefType::CROSS:
	case JoinRefType::POSITIONAL:
	case JoinRefType::DEPENDENT:
		break;
	}
	extra_using_columns = RemoveDuplicateUsingColumns(extra_using_columns);

	if (!extra_using_columns.empty()) {
		vector<optional_ptr<UsingColumnSet>> left_using_bindings;
		vector<optional_ptr<UsingColumnSet>> right_using_bindings;
		for (idx_t i = 0; i < extra_using_columns.size(); i++) {
			auto &using_column = extra_using_columns[i];
			// we check if there is ALREADY a using column of the same name in the left and right set
			// this can happen if we chain USING clauses
			// e.g. x JOIN y USING (c) JOIN z USING (c)
			auto left_using_binding = left_binder.bind_context.GetUsingBinding(using_column);
			auto right_using_binding = right_binder.bind_context.GetUsingBinding(using_column);
			if (!left_using_binding) {
				left_binder.bind_context.GetMatchingBinding(using_column);
			}
			if (!right_using_binding) {
				right_binder.bind_context.GetMatchingBinding(using_column);
			}
			left_using_bindings.push_back(left_using_binding);
			right_using_bindings.push_back(right_using_binding);
		}

		for (idx_t i = 0; i < extra_using_columns.size(); i++) {
			auto &using_column = extra_using_columns[i];
			BindingAlias left_binding;
			BindingAlias right_binding;

			auto set = make_uniq<UsingColumnSet>();
			auto &left_using_binding = left_using_bindings[i];
			auto &right_using_binding = right_using_bindings[i];
			left_binding = RetrieveUsingBinding(left_binder, left_using_binding, using_column, "left");
			right_binding = RetrieveUsingBinding(right_binder, right_using_binding, using_column, "right");

			// Last column of ASOF JOIN ... USING is >=
			const auto type = (ref.ref_type == JoinRefType::ASOF && i == extra_using_columns.size() - 1)
			                      ? ExpressionType::COMPARE_GREATERTHANOREQUALTO
			                      : ExpressionType::COMPARE_EQUAL;

			extra_conditions.push_back(
			    AddCondition(context, left_binder, right_binder, left_binding, right_binding, using_column, type));

			AddUsingBindings(*set, left_using_binding, left_binding);
			AddUsingBindings(*set, right_using_binding, right_binding);
			SetPrimaryBinding(*set, ref.type, left_binding, right_binding);
			bind_context.TransferUsingBinding(left_binder.bind_context, left_using_binding, *set, using_column);
			bind_context.TransferUsingBinding(right_binder.bind_context, right_using_binding, *set, using_column);
			AddUsingBindingSet(std::move(set));
		}
	}

	auto right_bindings = right_binder.bind_context.GetBindingAliases();
	auto left_bindings = left_binder.bind_context.GetBindingAliases();

	bind_context.AddContext(std::move(left_binder.bind_context));
	bind_context.AddContext(std::move(right_binder.bind_context));

	// Update the correlated columns for the parent binder
	// For the left binder, depth >= 1 indicates correlations from the parent binder
	for (const auto &col : left_binder.correlated_columns) {
		if (col.depth >= 1) {
			AddCorrelatedColumn(col);
		}
	}
	// For the right binder, depth > 1 indicates correlations from the parent binder
	// (depth = 1 indicates correlations from the left side of the join)
	for (auto col : right_binder.correlated_columns) {
		if (col.depth > 1) {
			// Decrement the depth to account for the effect of the lateral binder
			col.depth--;
			AddCorrelatedColumn(col);
		}
	}

	for (auto &condition : extra_conditions) {
		if (ref.condition) {
			ref.condition = make_uniq<ConjunctionExpression>(ExpressionType::CONJUNCTION_AND, std::move(ref.condition),
			                                                 std::move(condition));
		} else {
			ref.condition = std::move(condition);
		}
	}
	if (ref.condition) {
		WhereBinder binder(*this, context);
		result->condition = binder.Bind(ref.condition);
	}

	if (result->type == JoinType::SEMI || result->type == JoinType::ANTI || result->type == JoinType::MARK) {
		bind_context.RemoveContext(right_bindings);
		if (result->type == JoinType::MARK) {
			auto mark_join_idx = GenerateTableIndex();
			string mark_join_alias = "__internal_mark_join_ref" + to_string(mark_join_idx);
			bind_context.AddGenericBinding(mark_join_idx, mark_join_alias, {"__mark_index_column"},
			                               {LogicalType::BOOLEAN});
			result->mark_index = mark_join_idx;
		}
	}
	if (result->type == JoinType::RIGHT_SEMI || result->type == JoinType::RIGHT_ANTI) {
		bind_context.RemoveContext(left_bindings);
	}

	return std::move(result);
}